

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v2.cc
# Opt level: O0

RefEl lf::io::RefElOf(ElementType et)

{
  ostream *stream;
  runtime_error *this;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  ElementType local_10;
  RefElType local_9;
  ElementType et_local;
  
  local_10 = et;
  switch(et) {
  case EDGE2:
  case EDGE3:
  case EDGE4:
  case EDGE5:
  case EDGE6:
    local_9 = (RefElType)lf::base::RefEl::kSegment();
    break;
  case TRIA3:
  case TRIA6:
  case TRIA9:
  case TRIA10:
  case TRIA12:
  case TRIA15:
  case TRIA15_5:
  case TRIA21:
    local_9 = (RefElType)lf::base::RefEl::kTria();
    break;
  case QUAD4:
  case QUAD9:
  case QUAD8:
    local_9 = (RefElType)lf::base::RefEl::kQuad();
    break;
  case TET4:
  case HEX8:
  case PRISM6:
  case PYRAMID5:
  case TET10:
  case HEX27:
  case PRISM18:
  case PYRAMID14:
  case HEX20:
  case PRISM15:
  case PYRAMID13:
  case TET20:
  case TET35:
  case TET56:
  case HEX64:
  case HEX125:
  default:
    std::__cxx11::stringstream::stringstream(local_198);
    stream = std::operator<<(local_188,"Reference element not supported for GmshElement type ");
    operator<<(stream,local_10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"false",&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v2.cc"
               ,&local_1f1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1c8,&local_1f0,0x134,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"this code should not be reached");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case POINT:
    local_9 = (RefElType)lf::base::RefEl::kPoint();
  }
  return (RefEl)local_9;
}

Assistant:

base::RefEl RefElOf(GMshFileV2::ElementType et) {
  switch (et) {
    case GMshFileV2::ElementType::POINT:
      return base::RefEl::kPoint();

    case GMshFileV2::ElementType::EDGE2:
    case GMshFileV2::ElementType::EDGE3:
    case GMshFileV2::ElementType::EDGE4:
    case GMshFileV2::ElementType::EDGE5:
    case GMshFileV2::ElementType::EDGE6:
      return base::RefEl::kSegment();

    case GMshFileV2::ElementType::TRIA3:
    case GMshFileV2::ElementType::TRIA6:
    case GMshFileV2::ElementType::TRIA9:
    case GMshFileV2::ElementType::TRIA10:
    case GMshFileV2::ElementType::TRIA12:
    case GMshFileV2::ElementType::TRIA15:
    case GMshFileV2::ElementType::TRIA15_5:
    case GMshFileV2::ElementType::TRIA21:
      return base::RefEl::kTria();

    case GMshFileV2::ElementType::QUAD4:
    case GMshFileV2::ElementType::QUAD8:
    case GMshFileV2::ElementType::QUAD9:
      return base::RefEl::kQuad();

    case GMshFileV2::ElementType::TET4:
    case GMshFileV2::ElementType::HEX8:
    case GMshFileV2::ElementType::PRISM6:
    case GMshFileV2::ElementType::PYRAMID5:
    case GMshFileV2::ElementType::TET10:
    case GMshFileV2::ElementType::HEX27:
    case GMshFileV2::ElementType::PRISM18:
    case GMshFileV2::ElementType::PYRAMID14:
    case GMshFileV2::ElementType::HEX20:
    case GMshFileV2::ElementType::PRISM15:
    case GMshFileV2::ElementType::PYRAMID13:
    case GMshFileV2::ElementType::TET20:
    case GMshFileV2::ElementType::TET35:
    case GMshFileV2::ElementType::TET56:
    case GMshFileV2::ElementType::HEX64:
    case GMshFileV2::ElementType::HEX125:
    default:
      LF_VERIFY_MSG(
          false, "Reference element not supported for GmshElement type " << et);
  }
}